

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O0

uint32_t __thiscall
cppnet::BufferBlock::_Read(BufferBlock *this,char *res,uint32_t len,bool move_pt)

{
  ulong uVar1;
  size_t __n;
  ulong uVar2;
  size_t left;
  size_t size_1;
  size_t size_end;
  size_t size_start;
  size_t size;
  bool move_pt_local;
  uint32_t len_local;
  char *res_local;
  BufferBlock *this_local;
  
  this_local._4_4_ = len;
  if (this->_read < this->_write) {
    uVar1 = (long)this->_write - (long)this->_read;
    if (len < uVar1) {
      memcpy(res,this->_read,(ulong)len);
      if (move_pt) {
        this->_read = this->_read + len;
      }
    }
    else {
      memcpy(res,this->_read,uVar1);
      if (move_pt) {
        (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[4])();
      }
      this_local._4_4_ = (uint32_t)uVar1;
    }
  }
  else if (((this->_can_read & 1U) == 0) && (this->_read == this->_write)) {
    this_local._4_4_ = 0;
  }
  else {
    __n = (long)this->_write - (long)this->_buffer_start;
    uVar1 = (long)this->_buffer_end - (long)this->_read;
    uVar2 = __n + uVar1;
    if (len < uVar2) {
      if (uVar1 < len) {
        memcpy(res,this->_read,uVar1);
        memcpy(res + uVar1,this->_buffer_start,len - uVar1);
        if (move_pt) {
          this->_read = this->_buffer_start + (len - uVar1);
        }
      }
      else {
        memcpy(res,this->_read,(ulong)len);
        if (move_pt) {
          this->_read = this->_read + len;
        }
      }
    }
    else {
      memcpy(res,this->_read,uVar1);
      memcpy(res + uVar1,this->_buffer_start,__n);
      if (move_pt) {
        (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[4])();
      }
      this_local._4_4_ = (uint32_t)uVar2;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t BufferBlock::_Read(char* res, uint32_t len, bool move_pt) {
    /*s-----------r-----w-------------e*/
    if (_read < _write) {
        size_t size = _write - _read;
        // res can load all
        if (size <= len) {
            memcpy(res, _read, size);
            if(move_pt) {
                Clear();
            }
            return (uint32_t)size;

        // only read len
        } else {
            memcpy(res, _read, len);
            if(move_pt) {
                _read += len;
            }
            return len;
        }

    /*s-----------w-----r-------------e*/
    /*s----------------wr-------------e*/
    } else {
        if(!_can_read && _read == _write) {
            return 0;
        }
        size_t size_start = _write - _buffer_start;
        size_t size_end = _buffer_end - _read;
        size_t size =  size_start + size_end;
        // res can load all
        if (size <= len) {
            memcpy(res, _read, size_end);
            memcpy(res + size_end, _buffer_start, size_start);
            if(move_pt) {
                // reset point
                Clear();
            }
            return (uint32_t)size;

        } else {
            if (len <= size_end) {
                memcpy(res, _read, len);
                if(move_pt) {
                    _read += len;
                }
                return len;

            } else {
                size_t left = len - size_end;
                memcpy(res, _read, size_end);
                memcpy(res + size_end, _buffer_start, left);
                if(move_pt) {
                    _read = _buffer_start + left;
                }
                return len;
            }
        }
    }
}